

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  uint uVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  int *piVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i alVar7;
  undefined1 auVar8 [32];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  parasail_result_t *ppVar14;
  __m256i *ptr;
  int64_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  __m256i *palVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined8 uVar30;
  uint uVar31;
  ulong size;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  __m256i_64_t e;
  __m256i_64_t h;
  int local_274;
  long local_1e8;
  int local_1e0;
  longlong local_a0 [4];
  longlong local_80 [10];
  undefined1 auVar116 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_table_scan_profile_avx2_256_64_cold_8();
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      parasail_sg_flags_table_scan_profile_avx2_256_64_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_table_scan_profile_avx2_256_64_cold_6();
      }
      else {
        uVar28 = (ulong)(uint)s2Len;
        uVar1 = profile->s1Len;
        if ((int)uVar1 < 1) {
          parasail_sg_flags_table_scan_profile_avx2_256_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_table_scan_profile_avx2_256_64_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_table_scan_profile_avx2_256_64_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_table_scan_profile_avx2_256_64_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_table_scan_profile_avx2_256_64_cold_1();
        }
        else {
          iVar11 = uVar1 - 1;
          uVar29 = (ulong)uVar1 + 3;
          size = uVar29 >> 2;
          uVar31 = (uint)size;
          iVar12 = iVar11 / (int)uVar31;
          uVar26 = CONCAT44(0,open);
          iVar18 = -open;
          iVar13 = ppVar3->min;
          uVar20 = 0x8000000000000000 - (long)iVar13;
          if (iVar13 != iVar18 && SBORROW4(iVar13,iVar18) == iVar13 + open < 0) {
            uVar20 = uVar26 | 0x8000000000000000;
          }
          iVar13 = ppVar3->max;
          ppVar14 = parasail_result_new_table1((uint)uVar29 & 0x7ffffffc,s2Len);
          if (ppVar14 != (parasail_result_t *)0x0) {
            ppVar14->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar14->flag | 0x4820402;
            ptr = parasail_memalign___m256i(0x20,size);
            ptr_00 = parasail_memalign_int64_t(0x20,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m256i(0x20,size);
            ptr_02 = parasail_memalign___m256i(0x20,size);
            ptr_03 = parasail_memalign___m256i(0x20,size);
            if (ptr_03 != (__m256i *)0x0 &&
                ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                (ptr_00 != (int64_t *)0x0 && ptr != (__m256i *)0x0))) {
              iVar19 = s2Len + -1;
              iVar24 = 3 - iVar12;
              auVar64._8_4_ = open;
              auVar64._0_8_ = uVar26;
              auVar64._12_4_ = 0;
              auVar64._16_4_ = open;
              auVar64._20_4_ = 0;
              auVar64._24_4_ = open;
              auVar64._28_4_ = 0;
              uVar40 = CONCAT44(0,gap);
              auVar65._8_4_ = gap;
              auVar65._0_8_ = uVar40;
              auVar65._12_4_ = 0;
              auVar65._16_4_ = gap;
              auVar65._20_4_ = 0;
              auVar65._24_4_ = gap;
              auVar65._28_4_ = 0;
              uVar20 = uVar20 + 1;
              lVar36 = 0x7ffffffffffffffe - (long)iVar13;
              auVar59._8_8_ = lVar36;
              auVar59._0_8_ = lVar36;
              auVar59._16_8_ = lVar36;
              auVar59._24_8_ = lVar36;
              lVar36 = (long)(int)-(uVar31 * gap);
              auVar77._8_8_ = lVar36;
              auVar77._0_8_ = lVar36;
              auVar77._16_8_ = lVar36;
              auVar77._24_8_ = lVar36;
              auVar77 = vpblendd_avx2(auVar77,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
              auVar77 = vpaddq_avx2(ZEXT832(uVar20),auVar77);
              lVar36 = (long)iVar18;
              uVar32 = 0;
              do {
                lVar39 = 0;
                lVar37 = lVar36;
                do {
                  lVar23 = lVar37;
                  if (s1_beg != 0) {
                    lVar23 = 0;
                  }
                  local_80[lVar39] = lVar23;
                  local_a0[lVar39] = lVar23 - uVar26;
                  lVar39 = lVar39 + 1;
                  lVar37 = lVar37 - size * uVar40;
                } while (lVar39 != 4);
                palVar21 = ptr_02 + uVar32;
                (*palVar21)[0] = local_80[0];
                (*palVar21)[1] = local_80[1];
                (*palVar21)[2] = local_80[2];
                (*palVar21)[3] = local_80[3];
                palVar21 = ptr + uVar32;
                (*palVar21)[0] = local_a0[0];
                (*palVar21)[1] = local_a0[1];
                (*palVar21)[2] = local_a0[2];
                (*palVar21)[3] = local_a0[3];
                uVar32 = uVar32 + 1;
                lVar36 = lVar36 - uVar40;
              } while (uVar32 != size);
              *ptr_00 = 0;
              uVar26 = 1;
              do {
                iVar13 = 0;
                if (s2_beg == 0) {
                  iVar13 = iVar18;
                }
                ptr_00[uVar26] = (long)iVar13;
                uVar26 = uVar26 + 1;
                iVar18 = iVar18 - gap;
              } while (s2Len + 1 != uVar26);
              alVar7 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar64);
              palVar21 = ptr_03 + (uVar31 - 1);
              auVar81 = ZEXT3264(auVar59);
              uVar26 = size;
              do {
                *palVar21 = alVar7;
                alVar7 = (__m256i)vpsubq_avx2((undefined1  [32])alVar7,auVar65);
                uVar32 = alVar7[0];
                if ((long)auVar81._0_8_ < (long)alVar7[0]) {
                  uVar32 = auVar81._0_8_;
                }
                uVar33 = vpextrq_avx(auVar81._0_16_,1);
                uVar40 = vpextrq_avx(alVar7._0_16_,1);
                if ((long)uVar33 < (long)uVar40) {
                  uVar40 = uVar33;
                }
                uVar33 = alVar7[2];
                if ((long)auVar81._16_8_ < (long)alVar7[2]) {
                  uVar33 = auVar81._16_8_;
                }
                uVar34 = vpextrq_avx(auVar81._16_16_,1);
                uVar42 = vpextrq_avx(alVar7._16_16_,1);
                if ((long)uVar34 < (long)uVar42) {
                  uVar42 = uVar34;
                }
                auVar78._8_8_ = 0;
                auVar78._0_8_ = uVar42;
                auVar86._8_8_ = 0;
                auVar86._0_8_ = uVar33;
                auVar78 = vpunpcklqdq_avx(auVar86,auVar78);
                auVar87._8_8_ = 0;
                auVar87._0_8_ = uVar40;
                auVar93._8_8_ = 0;
                auVar93._0_8_ = uVar32;
                auVar86 = vpunpcklqdq_avx(auVar93,auVar87);
                auVar81 = ZEXT3264(CONCAT1616(ZEXT116(1) * auVar78,
                                              ZEXT116(0) * auVar78 + ZEXT116(1) * auVar86));
                palVar21 = palVar21 + -1;
                iVar13 = (int)uVar26;
                uVar25 = iVar13 - 1;
                uVar26 = (ulong)uVar25;
              } while (uVar25 != 0 && 0 < iVar13);
              palVar21 = ptr_02 + (uint)(iVar11 % (int)uVar31);
              uVar26 = 1;
              if (1 < s2Len) {
                uVar26 = uVar28;
              }
              lVar37 = (ulong)(uVar31 + (uVar31 == 0)) << 5;
              lVar36 = size * uVar28;
              local_1e8 = 0;
              auVar6._8_8_ = uVar20;
              auVar6._0_8_ = uVar20;
              auVar6._16_8_ = uVar20;
              auVar6._24_8_ = uVar20;
              auVar84 = ZEXT3264(auVar6);
              auVar75 = ZEXT3264(auVar6);
              uVar32 = 0;
              local_274 = iVar19;
              do {
                auVar78 = SUB3216(ptr_02[uVar31 - 1],0);
                auVar101._0_16_ = ZEXT116(0) * auVar78 + ZEXT116(1) * auVar77._0_16_;
                auVar101._16_16_ = ZEXT116(0) * auVar77._16_16_ + ZEXT116(1) * auVar78;
                auVar6 = vpalignr_avx2((undefined1  [32])ptr_02[uVar31 - 1],auVar101,8);
                auVar6 = vpblendd_avx2(auVar6,ZEXT832((ulong)ptr_00[uVar32]),3);
                iVar13 = ppVar3->mapper[(byte)s2[uVar32]];
                auVar102._8_8_ = uVar20;
                auVar102._0_8_ = uVar20;
                auVar102._16_8_ = uVar20;
                auVar102._24_8_ = uVar20;
                auVar101 = vpsubq_avx2(auVar102,(undefined1  [32])*ptr_03);
                lVar39 = 0;
                do {
                  auVar92 = vpaddq_avx2(auVar6,*(undefined1 (*) [32])
                                                ((long)pvVar2 + lVar39 + size * (long)iVar13 * 0x20)
                                       );
                  auVar6 = *(undefined1 (*) [32])((long)*ptr_02 + lVar39);
                  auVar116 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr + lVar39),auVar65);
                  auVar60 = vpsubq_avx2(auVar6,auVar64);
                  uVar40 = auVar60._0_8_;
                  if ((long)auVar60._0_8_ < (long)auVar116._0_8_) {
                    uVar40 = auVar116._0_8_;
                  }
                  uVar42 = vpextrq_avx(auVar116._0_16_,1);
                  uVar33 = vpextrq_avx(auVar60._0_16_,1);
                  if ((long)uVar33 < (long)uVar42) {
                    uVar33 = uVar42;
                  }
                  uVar42 = auVar60._16_8_;
                  if ((long)auVar60._16_8_ < (long)auVar116._16_8_) {
                    uVar42 = auVar116._16_8_;
                  }
                  uVar15 = vpextrq_avx(auVar116._16_16_,1);
                  uVar34 = vpextrq_avx(auVar60._16_16_,1);
                  if ((long)uVar34 < (long)uVar15) {
                    uVar34 = uVar15;
                  }
                  auVar101 = vpaddq_avx2(auVar101,*(undefined1 (*) [32])((long)*ptr_03 + lVar39));
                  uVar15 = auVar101._0_8_;
                  if ((long)auVar101._0_8_ < (long)auVar102._0_8_) {
                    uVar15 = auVar102._0_8_;
                  }
                  uVar22 = vpextrq_avx(auVar102._0_16_,1);
                  uVar16 = vpextrq_avx(auVar101._0_16_,1);
                  if ((long)uVar16 < (long)uVar22) {
                    uVar16 = uVar22;
                  }
                  uVar22 = auVar101._16_8_;
                  if ((long)auVar101._16_8_ < (long)auVar102._16_8_) {
                    uVar22 = auVar102._16_8_;
                  }
                  uVar44 = vpextrq_avx(auVar102._16_16_,1);
                  uVar47 = vpextrq_avx(auVar101._16_16_,1);
                  if ((long)uVar47 < (long)uVar44) {
                    uVar47 = uVar44;
                  }
                  uVar44 = uVar40;
                  if ((long)uVar40 <= (long)auVar92._0_8_) {
                    uVar44 = auVar92._0_8_;
                  }
                  uVar45 = vpextrq_avx(auVar92._0_16_,1);
                  uVar27 = uVar33;
                  if ((long)uVar33 <= (long)uVar45) {
                    uVar27 = uVar45;
                  }
                  uVar45 = uVar42;
                  if ((long)uVar42 <= (long)auVar92._16_8_) {
                    uVar45 = auVar92._16_8_;
                  }
                  uVar46 = vpextrq_avx(auVar92._16_16_,1);
                  uVar35 = uVar34;
                  if ((long)uVar34 <= (long)uVar46) {
                    uVar35 = uVar46;
                  }
                  auVar98._8_8_ = 0;
                  auVar98._0_8_ = uVar40;
                  auVar113._8_8_ = 0;
                  auVar113._0_8_ = uVar33;
                  auVar78 = vpunpcklqdq_avx(auVar98,auVar113);
                  auVar51._8_8_ = 0;
                  auVar51._0_8_ = uVar34;
                  auVar104._8_8_ = 0;
                  auVar104._0_8_ = uVar42;
                  auVar86 = vpunpcklqdq_avx(auVar104,auVar51);
                  auVar99._8_8_ = 0;
                  auVar99._0_8_ = uVar47;
                  auVar105._8_8_ = 0;
                  auVar105._0_8_ = uVar22;
                  auVar87 = vpunpcklqdq_avx(auVar105,auVar99);
                  auVar106._8_8_ = 0;
                  auVar106._0_8_ = uVar16;
                  auVar110._8_8_ = 0;
                  auVar110._0_8_ = uVar15;
                  auVar93 = vpunpcklqdq_avx(auVar110,auVar106);
                  auVar102._0_16_ = ZEXT116(0) * auVar87 + ZEXT116(1) * auVar93;
                  auVar102._16_16_ = ZEXT116(1) * auVar87;
                  auVar107._8_8_ = 0;
                  auVar107._0_8_ = uVar44;
                  auVar111._8_8_ = 0;
                  auVar111._0_8_ = uVar27;
                  auVar87 = vpunpcklqdq_avx(auVar107,auVar111);
                  auVar114._8_8_ = 0;
                  auVar114._0_8_ = uVar45;
                  auVar116._0_16_ = ZEXT116(0) * auVar114 + ZEXT116(1) * auVar87;
                  auVar116._16_16_ = ZEXT116(1) * auVar114;
                  auVar92._8_8_ = uVar35;
                  auVar92._0_8_ = uVar35;
                  auVar92._16_8_ = uVar35;
                  auVar92._24_8_ = uVar35;
                  auVar101 = vpblendd_avx2(auVar116,auVar92,0xc0);
                  *(undefined1 (*) [16])((long)*ptr + lVar39 + 0x10) = auVar86;
                  *(undefined1 (*) [16])((long)*ptr + lVar39) = auVar78;
                  *(undefined1 (*) [32])((long)*ptr_01 + lVar39) = auVar101;
                  lVar39 = lVar39 + 0x20;
                } while (lVar37 != lVar39);
                auVar60._8_8_ = uVar27;
                auVar60._0_8_ = uVar27;
                auVar60._16_8_ = uVar27;
                auVar60._24_8_ = uVar27;
                auVar6 = vpunpcklqdq_avx2(auVar60,auVar116);
                uVar40 = ptr_00[uVar32 + 1];
                auVar6 = vpblendd_avx2(auVar6,ZEXT832(uVar40),3);
                auVar6 = vpaddq_avx2(auVar6,(undefined1  [32])*ptr_03);
                uVar33 = auVar6._0_8_;
                if ((long)auVar6._0_8_ < (long)uVar15) {
                  uVar33 = uVar15;
                }
                uVar42 = vpextrq_avx(auVar6._0_16_,1);
                if ((long)uVar42 < (long)uVar16) {
                  uVar42 = uVar16;
                }
                uVar34 = auVar6._16_8_;
                if ((long)auVar6._16_8_ < (long)uVar22) {
                  uVar34 = uVar22;
                }
                uVar15 = vpextrq_avx(auVar6._16_16_,1);
                uVar16 = uVar32 + 1;
                if ((long)uVar15 < (long)uVar47) {
                  uVar15 = uVar47;
                }
                auVar52._8_8_ = 0;
                auVar52._0_8_ = uVar15;
                auVar66._8_8_ = 0;
                auVar66._0_8_ = uVar34;
                auVar78 = vpunpcklqdq_avx(auVar66,auVar52);
                auVar67._8_8_ = 0;
                auVar67._0_8_ = uVar42;
                auVar88._8_8_ = 0;
                auVar88._0_8_ = uVar33;
                auVar86 = vpunpcklqdq_avx(auVar88,auVar67);
                auVar96._0_16_ = ZEXT116(0) * auVar78 + ZEXT116(1) * auVar86;
                auVar96._16_16_ = ZEXT116(1) * auVar78;
                iVar13 = 1;
                do {
                  auVar6 = vperm2i128_avx2(auVar96,auVar96,8);
                  auVar6 = vpalignr_avx2(auVar96,auVar6,8);
                  auVar6 = vpaddq_avx2(auVar77,auVar6);
                  uVar33 = auVar6._0_8_;
                  if ((long)auVar6._0_8_ < (long)auVar96._0_8_) {
                    uVar33 = auVar96._0_8_;
                  }
                  uVar34 = vpextrq_avx(auVar96._0_16_,1);
                  uVar42 = vpextrq_avx(auVar6._0_16_,1);
                  if ((long)uVar42 < (long)uVar34) {
                    uVar42 = uVar34;
                  }
                  uVar34 = auVar6._16_8_;
                  if ((long)auVar6._16_8_ < (long)auVar96._16_8_) {
                    uVar34 = auVar96._16_8_;
                  }
                  auVar89._8_8_ = 0;
                  auVar89._0_8_ = uVar33;
                  auVar100._8_8_ = 0;
                  auVar100._0_8_ = uVar42;
                  auVar78 = vpunpcklqdq_avx(auVar89,auVar100);
                  lVar23 = vpextrq_avx(auVar96._16_16_,1);
                  lVar39 = vpextrq_avx(auVar6._16_16_,1);
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = uVar34;
                  auVar109._0_16_ = ZEXT116(0) * auVar95 + ZEXT116(1) * auVar78;
                  auVar109._16_16_ = ZEXT116(1) * auVar95;
                  if (lVar39 < lVar23) {
                    lVar39 = lVar23;
                  }
                  auVar61._8_8_ = lVar39;
                  auVar61._0_8_ = lVar39;
                  auVar61._16_8_ = lVar39;
                  auVar61._24_8_ = lVar39;
                  auVar96 = vpblendd_avx2(auVar109,auVar61,0xc0);
                  iVar13 = iVar13 + -1;
                } while (iVar13 == 0);
                auVar53._8_8_ = uVar42;
                auVar53._0_8_ = uVar42;
                auVar62._16_16_ = ZEXT116(1) * auVar53;
                auVar62._0_16_ = ZEXT116(0) * auVar53;
                auVar6 = vpalignr_avx2(auVar109,auVar62,8);
                auVar103 = vpaddq_avx2(auVar6,ZEXT832(uVar20));
                uVar33 = auVar103._0_8_;
                if ((long)auVar103._0_8_ < (long)uVar40) {
                  uVar33 = uVar40;
                }
                uVar40 = vpextrq_avx(auVar103._0_16_,1);
                if ((long)uVar40 < (long)uVar44) {
                  uVar40 = uVar44;
                }
                uVar42 = auVar103._16_8_;
                if ((long)auVar103._16_8_ < (long)uVar27) {
                  uVar42 = uVar27;
                }
                uVar34 = vpextrq_avx(auVar103._16_16_,1);
                if ((long)uVar34 < (long)uVar45) {
                  uVar34 = uVar45;
                }
                auVar54._8_8_ = 0;
                auVar54._0_8_ = uVar34;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = uVar42;
                auVar78 = vpunpcklqdq_avx(auVar68,auVar54);
                auVar69._8_8_ = 0;
                auVar69._0_8_ = uVar40;
                auVar90._8_8_ = 0;
                auVar90._0_8_ = uVar33;
                auVar86 = vpunpcklqdq_avx(auVar90,auVar69);
                auVar97._0_16_ = ZEXT116(0) * auVar78 + ZEXT116(1) * auVar86;
                auVar97._16_16_ = ZEXT116(1) * auVar78;
                lVar23 = 0;
                lVar39 = local_1e8;
                do {
                  auVar6 = vpsubq_avx2(auVar103,auVar65);
                  auVar101 = vpsubq_avx2(auVar97,auVar64);
                  uVar40 = auVar101._0_8_;
                  if ((long)auVar101._0_8_ < (long)auVar6._0_8_) {
                    uVar40 = auVar6._0_8_;
                  }
                  uVar42 = vpextrq_avx(auVar6._0_16_,1);
                  uVar33 = vpextrq_avx(auVar101._0_16_,1);
                  if ((long)uVar33 < (long)uVar42) {
                    uVar33 = uVar42;
                  }
                  uVar42 = auVar101._16_8_;
                  if ((long)auVar101._16_8_ < (long)auVar6._16_8_) {
                    uVar42 = auVar6._16_8_;
                  }
                  uVar15 = vpextrq_avx(auVar6._16_16_,1);
                  uVar34 = vpextrq_avx(auVar101._16_16_,1);
                  if ((long)uVar34 < (long)uVar15) {
                    uVar34 = uVar15;
                  }
                  uVar15 = *(ulong *)((long)*ptr_01 + lVar23);
                  if ((long)uVar15 <= (long)uVar40) {
                    uVar15 = uVar40;
                  }
                  uVar22 = *(ulong *)((long)*ptr_01 + lVar23 + 8);
                  if ((long)uVar22 <= (long)uVar33) {
                    uVar22 = uVar33;
                  }
                  uVar47 = *(ulong *)((long)*ptr_01 + lVar23 + 0x10);
                  if ((long)uVar47 <= (long)uVar42) {
                    uVar47 = uVar42;
                  }
                  auVar55._8_8_ = 0;
                  auVar55._0_8_ = uVar22;
                  auVar70._8_8_ = 0;
                  auVar70._0_8_ = uVar15;
                  auVar78 = vpunpcklqdq_avx(auVar70,auVar55);
                  uVar44 = *(ulong *)((long)*ptr_01 + lVar23 + 0x18);
                  if ((long)uVar44 <= (long)uVar34) {
                    uVar44 = uVar34;
                  }
                  auVar71._8_8_ = 0;
                  auVar71._0_8_ = uVar47;
                  auVar63._0_16_ = ZEXT116(0) * auVar71 + ZEXT116(1) * auVar78;
                  auVar63._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar71;
                  auVar74._8_8_ = uVar44;
                  auVar74._0_8_ = uVar44;
                  auVar74._16_8_ = uVar44;
                  auVar74._24_8_ = uVar44;
                  auVar97 = vpblendd_avx2(auVar63,auVar74,0xc0);
                  *(undefined1 (*) [32])((long)*ptr_02 + lVar23) = auVar97;
                  uVar27 = auVar81._0_8_;
                  if ((long)uVar15 <= (long)auVar81._0_8_) {
                    uVar27 = uVar15;
                  }
                  uVar45 = vpextrq_avx(auVar81._0_16_,1);
                  if ((long)uVar22 <= (long)uVar45) {
                    uVar45 = uVar22;
                  }
                  uVar35 = auVar81._16_8_;
                  if ((long)uVar47 <= (long)auVar81._16_8_) {
                    uVar35 = uVar47;
                  }
                  uVar46 = vpextrq_avx(auVar81._16_16_,1);
                  if ((long)uVar44 <= (long)uVar46) {
                    uVar46 = uVar44;
                  }
                  if ((long)uVar40 <= (long)uVar27) {
                    uVar27 = uVar40;
                  }
                  if ((long)uVar33 <= (long)uVar45) {
                    uVar45 = uVar33;
                  }
                  if ((long)uVar42 <= (long)uVar35) {
                    uVar35 = uVar42;
                  }
                  if ((long)uVar34 <= (long)uVar46) {
                    uVar46 = uVar34;
                  }
                  uVar41 = auVar84._0_8_;
                  if ((long)auVar84._0_8_ <= (long)uVar15) {
                    uVar41 = uVar15;
                  }
                  uVar38 = vpextrq_avx(auVar84._0_16_,1);
                  if ((long)uVar38 <= (long)uVar22) {
                    uVar38 = uVar22;
                  }
                  uVar43 = auVar84._16_8_;
                  if ((long)auVar84._16_8_ <= (long)uVar47) {
                    uVar43 = uVar47;
                  }
                  piVar4 = ((ppVar14->field_4).rowcols)->score_row;
                  uVar17 = vpextrq_avx(auVar84._16_16_,1);
                  *(int *)((long)piVar4 + lVar39) = (int)uVar15;
                  if ((long)uVar17 <= (long)uVar44) {
                    uVar17 = uVar44;
                  }
                  *(int *)((long)piVar4 + lVar36 * 4 + lVar39) = (int)uVar22;
                  *(int *)((long)piVar4 + lVar36 * 8 + lVar39) = (int)uVar47;
                  *(int *)((long)piVar4 + lVar36 * 0xc + lVar39) = (int)uVar44;
                  auVar56._8_8_ = 0;
                  auVar56._0_8_ = uVar34;
                  auVar72._8_8_ = 0;
                  auVar72._0_8_ = uVar42;
                  auVar78 = vpunpcklqdq_avx(auVar72,auVar56);
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ = uVar33;
                  auVar82._8_8_ = 0;
                  auVar82._0_8_ = uVar40;
                  auVar86 = vpunpcklqdq_avx(auVar82,auVar79);
                  auVar103._0_16_ = ZEXT116(0) * auVar78 + ZEXT116(1) * auVar86;
                  auVar103._16_16_ = ZEXT116(1) * auVar78;
                  auVar91._8_8_ = 0;
                  auVar91._0_8_ = uVar46;
                  auVar108._8_8_ = 0;
                  auVar108._0_8_ = uVar35;
                  auVar78 = vpunpcklqdq_avx(auVar108,auVar91);
                  auVar112._8_8_ = 0;
                  auVar112._0_8_ = uVar45;
                  auVar115._8_8_ = 0;
                  auVar115._0_8_ = uVar27;
                  auVar86 = vpunpcklqdq_avx(auVar115,auVar112);
                  auVar80._0_16_ = ZEXT116(0) * auVar78 + ZEXT116(1) * auVar86;
                  auVar80._16_16_ = ZEXT116(1) * auVar78;
                  auVar81 = ZEXT3264(auVar80);
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = uVar43;
                  auVar94._8_8_ = 0;
                  auVar94._0_8_ = uVar17;
                  auVar78 = vpunpcklqdq_avx(auVar49,auVar94);
                  auVar76._8_8_ = 0;
                  auVar76._0_8_ = uVar41;
                  auVar85._8_8_ = 0;
                  auVar85._0_8_ = uVar38;
                  auVar86 = vpunpcklqdq_avx(auVar76,auVar85);
                  auVar83._0_16_ = ZEXT116(0) * auVar78 + ZEXT116(1) * auVar86;
                  auVar83._16_16_ = ZEXT116(1) * auVar78;
                  auVar84 = ZEXT3264(auVar83);
                  lVar23 = lVar23 + 0x20;
                  lVar39 = lVar39 + uVar28 * 4;
                } while (lVar37 != lVar23);
                auVar6 = vpcmpgtq_avx2((undefined1  [32])*palVar21,auVar75._0_32_);
                uVar40 = auVar75._0_8_;
                if ((long)auVar75._0_8_ < (*palVar21)[0]) {
                  uVar40 = (*palVar21)[0];
                }
                uVar33 = vpextrq_avx(auVar75._0_16_,1);
                if ((long)uVar33 < (*palVar21)[1]) {
                  uVar33 = (*palVar21)[1];
                }
                uVar42 = auVar75._16_8_;
                if ((long)auVar75._16_8_ < (*palVar21)[2]) {
                  uVar42 = (*palVar21)[2];
                }
                uVar34 = vpextrq_avx(auVar75._16_16_,1);
                if ((long)uVar34 < (*palVar21)[3]) {
                  uVar34 = (*palVar21)[3];
                }
                auVar50._8_8_ = 0;
                auVar50._0_8_ = uVar34;
                auVar57._8_8_ = 0;
                auVar57._0_8_ = uVar42;
                auVar78 = vpunpcklqdq_avx(auVar57,auVar50);
                auVar58._8_8_ = 0;
                auVar58._0_8_ = uVar33;
                auVar73._8_8_ = 0;
                auVar73._0_8_ = uVar40;
                auVar86 = vpunpcklqdq_avx(auVar73,auVar58);
                auVar87 = ZEXT116(1) * auVar78;
                auVar75 = ZEXT3264(CONCAT1616(auVar87,ZEXT116(0) * auVar78 + ZEXT116(1) * auVar86));
                auVar5._8_8_ = -(ulong)(iVar24 == 2);
                auVar5._0_8_ = -(ulong)(iVar24 == 3);
                auVar5._16_8_ = -(ulong)(iVar24 == 1);
                auVar5._24_8_ = -(ulong)(iVar24 == 0);
                auVar5 = auVar5 & auVar6;
                local_1e0 = (int)uVar32;
                if ((((auVar5 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     SUB321(auVar5 >> 0x7f,0) != '\0') || SUB321(auVar5 >> 0xbf,0) != '\0') ||
                    auVar5[0x1f] < '\0') {
                  local_274 = local_1e0;
                }
                local_1e8 = local_1e8 + 4;
                uVar32 = uVar16;
              } while (uVar16 != uVar26);
              uVar28 = uVar20;
              if (s2_end != 0) {
                if (iVar12 < 3) {
                  iVar13 = 1;
                  if (1 < iVar24) {
                    iVar13 = iVar24;
                  }
                  do {
                    auVar64 = auVar75._0_32_;
                    auVar77 = vperm2i128_avx2(auVar64,auVar64,8);
                    auVar77 = vpalignr_avx2(auVar64,auVar77,8);
                    auVar87 = auVar77._16_16_;
                    auVar75 = ZEXT3264(auVar77);
                    iVar13 = iVar13 + -1;
                  } while (iVar13 != 0);
                }
                uVar28 = vpextrq_avx(auVar87,1);
              }
              iVar13 = iVar11;
              if ((s1_end != 0) && ((uVar29 & 0x7ffffffc) != 0)) {
                uVar26 = 0;
                uVar29 = uVar28;
                do {
                  iVar18 = ((uint)uVar26 & 3) * uVar31 + ((uint)(uVar26 >> 2) & 0x3fffffff);
                  uVar28 = uVar29;
                  iVar9 = iVar13;
                  iVar10 = local_274;
                  if ((iVar18 < (int)uVar1) &&
                     (uVar28 = (*ptr_02)[uVar26], iVar9 = iVar18, iVar10 = iVar19,
                     (long)uVar28 <= (long)uVar29)) {
                    if (iVar13 <= iVar18) {
                      iVar18 = iVar13;
                    }
                    if (local_274 != iVar19) {
                      iVar18 = iVar13;
                    }
                    bVar48 = uVar28 == uVar29;
                    uVar28 = uVar29;
                    iVar9 = iVar13;
                    iVar10 = local_274;
                    if (bVar48) {
                      iVar9 = iVar18;
                    }
                  }
                  local_274 = iVar10;
                  iVar13 = iVar9;
                  uVar26 = uVar26 + 1;
                  uVar29 = uVar28;
                } while ((uVar31 & 0x1fffffff) << 2 != (int)uVar26);
              }
              iVar18 = (int)uVar28;
              if (s2_end == 0 && s1_end == 0) {
                alVar7 = ptr_02[(uint)(iVar11 % (int)uVar31)];
                auVar78 = alVar7._16_16_;
                if (iVar12 < 3) {
                  iVar13 = 1;
                  if (1 < iVar24) {
                    iVar13 = iVar24;
                  }
                  do {
                    auVar77 = vperm2i128_avx2((undefined1  [32])alVar7,(undefined1  [32])alVar7,8);
                    alVar7 = (__m256i)vpalignr_avx2((undefined1  [32])alVar7,auVar77,8);
                    auVar78 = alVar7._16_16_;
                    iVar13 = iVar13 + -1;
                  } while (iVar13 != 0);
                }
                uVar30 = vpextrq_avx(auVar78,1);
                iVar18 = (int)uVar30;
                iVar13 = iVar11;
                local_274 = iVar19;
              }
              auVar8._8_8_ = uVar20;
              auVar8._0_8_ = uVar20;
              auVar8._16_8_ = uVar20;
              auVar8._24_8_ = uVar20;
              auVar77 = vpcmpgtq_avx2(auVar8,auVar80);
              auVar59 = vpcmpgtq_avx2(auVar83,auVar59);
              auVar77 = vpor_avx2(auVar59,auVar77);
              if ((((auVar77 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   SUB321(auVar77 >> 0x7f,0) != '\0') || SUB321(auVar77 >> 0xbf,0) != '\0') ||
                  auVar77[0x1f] < '\0') {
                *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                iVar18 = 0;
                local_274 = 0;
                iVar13 = 0;
              }
              ppVar14->score = iVar18;
              ppVar14->end_query = iVar13;
              ppVar14->end_ref = local_274;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar14;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m256i vCompare;
            vH = _mm256_load_si256(pvH + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}